

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::Json_ActiveOperationalDatasetEncodingDecoding_Test::TestBody
          (Json_ActiveOperationalDatasetEncodingDecoding_Test *this)

{
  ActiveOperationalDataset *aDataset;
  ByteArray *aBytes;
  ActiveOperationalDataset *aDataset_00;
  ActiveOperationalDataset *aDataset_01;
  char *message;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertHelper local_260;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  AssertHelper local_208;
  string json;
  string kNetworkMasterKey;
  ActiveOperationalDataset dataset1;
  ActiveOperationalDataset dataset;
  
  std::__cxx11::string::string
            ((string *)&kNetworkMasterKey,"0123456789abcdef0123456789abcdef",(allocator *)&dataset);
  ActiveOperationalDataset::ActiveOperationalDataset(&dataset);
  utils::Hex((Error *)&dataset1,&dataset.mNetworkMasterKey,&kNetworkMasterKey);
  gtest_ar_.success_ =
       CONCAT22(dataset1.mActiveTimestamp._2_2_,
                CONCAT11(dataset1.mActiveTimestamp._1_1_,dataset1.mActiveTimestamp._0_1_)) == 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&dataset1.mExtendedPanId);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&json);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&dataset1,(internal *)&gtest_ar_,
               (AssertionResult *)
               "utils::Hex(dataset.mNetworkMasterKey, kNetworkMasterKey) == ErrorCode::kNone",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x34,(char *)CONCAT44(dataset1.mActiveTimestamp._4_4_,
                                      CONCAT22(dataset1.mActiveTimestamp._2_2_,
                                               CONCAT11(dataset1.mActiveTimestamp._1_1_,
                                                        dataset1.mActiveTimestamp._0_1_))));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&json);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&dataset1);
    if (json._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)json._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  dataset.mPresentFlags._1_1_ = dataset.mPresentFlags._1_1_ | 4;
  ActiveDatasetToJson_abi_cxx11_(&json,(commissioner *)&dataset,aDataset);
  ActiveOperationalDataset::ActiveOperationalDataset(&dataset1);
  ActiveDatasetFromJson((Error *)&gtest_ar_,&dataset1,&json);
  gtest_ar__1.success_ = CONCAT22(gtest_ar_._2_2_,CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_)) == 0
  ;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x3a,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ = SUB41((dataset1.mPresentFlags & 0x400) >> 10,0);
  if ((dataset1.mPresentFlags & 0x400) == 0) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "(dataset1.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x3c,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  utils::Hex_abi_cxx11_((string *)&gtest_ar_,(utils *)&dataset1.mNetworkMasterKey,aBytes);
  gtest_ar__1.success_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar_,&kNetworkMasterKey);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar_);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"utils::Hex(dataset1.mNetworkMasterKey) == kNetworkMasterKey",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x3d,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  ActiveOperationalDataset::~ActiveOperationalDataset(&dataset1);
  std::__cxx11::string::~string((string *)&json);
  dataset1.mActiveTimestamp._0_1_ = 5;
  dataset1.mActiveTimestamp._1_1_ = 0xff;
  __l._M_len = 2;
  __l._M_array = (iterator)&dataset1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__1,__l,
             (allocator_type *)&gtest_ar_);
  dataset.mSecurityPolicy.mRotationTime = 0x20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&dataset.mSecurityPolicy.mFlags,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__1);
  dataset.mPresentFlags._0_1_ = (byte)dataset.mPresentFlags | 0x40;
  ActiveDatasetToJson_abi_cxx11_(&json,(commissioner *)&dataset,aDataset_00);
  ActiveOperationalDataset::ActiveOperationalDataset(&dataset1);
  ActiveDatasetFromJson((Error *)&gtest_ar_,&dataset1,&json);
  gtest_ar__4.success_ = CONCAT22(gtest_ar_._2_2_,CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_)) == 0
  ;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  if (gtest_ar__4.success_ == false) {
    testing::Message::Message((Message *)&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)"ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x4a,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_260.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_260.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__4.success_ = SUB41((dataset1.mPresentFlags & 0x40) >> 6,0);
  if ((dataset1.mPresentFlags & 0x40) == 0) {
    testing::Message::Message((Message *)&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,
               (AssertionResult *)
               "(dataset1.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x4b,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_260.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_260.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__4.message_);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&gtest_ar_,"dataset1.mSecurityPolicy.mFlags","kSecurityPolicyFlags",
             &dataset1.mSecurityPolicy.mFlags,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__1);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__4);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_4657bc + 9;
    }
    else {
      message = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x4c,message);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ActiveOperationalDataset::~ActiveOperationalDataset(&dataset1);
  std::__cxx11::string::~string((string *)&json);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__1);
  dataset1.mActiveTimestamp._0_1_ = 1;
  gtest_ar_.success_ = true;
  gtest_ar_._1_1_ = 0xee;
  __l_00._M_len = 2;
  __l_00._M_array = &gtest_ar_.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&dataset1.mExtendedPanId,__l_00,(allocator_type *)&json);
  std::vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
  ::_M_assign_aux<ot::commissioner::ChannelMaskEntry_const*>
            ((vector<ot::commissioner::ChannelMaskEntry,std::allocator<ot::commissioner::ChannelMaskEntry>>
              *)&dataset.mChannelMask,&dataset1,&dataset1.mPanId);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&dataset1.mExtendedPanId.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  dataset.mPresentFlags._1_1_ = dataset.mPresentFlags._1_1_ | 0x20;
  ActiveDatasetToJson_abi_cxx11_(&json,(commissioner *)&dataset,aDataset_01);
  ActiveOperationalDataset::ActiveOperationalDataset(&dataset1);
  ActiveDatasetFromJson((Error *)&gtest_ar_,&dataset1,&json);
  gtest_ar__1.success_ = CONCAT22(gtest_ar_._2_2_,CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_)) == 0
  ;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x57,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ = SUB41((dataset1.mPresentFlags & 0x2000) >> 0xd,0);
  if ((dataset1.mPresentFlags & 0x2000) == 0) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "(dataset1.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit)","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x58,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ =
       (long)dataset1.mChannelMask.
             super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)dataset1.mChannelMask.
             super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x20;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"dataset1.mChannelMask.size() == 1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x59,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ =
       (dataset1.mChannelMask.
        super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
        ._M_impl.super__Vector_impl_data._M_start)->mPage == '\x01';
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"dataset1.mChannelMask[0].mPage == 1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x5a,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar__1.success_ =
       std::operator==(&(dataset1.mChannelMask.
                         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->mMasks,
                       &(dataset.mChannelMask.
                         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->mMasks);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "dataset1.mChannelMask[0].mMasks == dataset.mChannelMask[0].mMasks","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/json_test.cpp"
               ,0x5b,(char *)CONCAT44(gtest_ar_._4_4_,
                                      CONCAT22(gtest_ar_._2_2_,
                                               CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__4._1_7_,gtest_ar__4.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  ActiveOperationalDataset::~ActiveOperationalDataset(&dataset1);
  std::__cxx11::string::~string((string *)&json);
  ActiveOperationalDataset::~ActiveOperationalDataset(&dataset);
  std::__cxx11::string::~string((string *)&kNetworkMasterKey);
  return;
}

Assistant:

TEST(Json, ActiveOperationalDatasetEncodingDecoding)
{
    const std::string        kNetworkMasterKey = "0123456789abcdef0123456789abcdef";
    ActiveOperationalDataset dataset;

    // network master key serialization & deserialization
    {
        EXPECT_TRUE(utils::Hex(dataset.mNetworkMasterKey, kNetworkMasterKey) == ErrorCode::kNone);
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkMasterKeyBit;

        std::string json = ActiveDatasetToJson(dataset);

        ActiveOperationalDataset dataset1;
        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);

        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit));
        EXPECT_TRUE(utils::Hex(dataset1.mNetworkMasterKey) == kNetworkMasterKey);
    }

    // security policy serialization & deserialization
    {
        const ByteArray kSecurityPolicyFlags  = {0x05, 0xff};
        dataset.mSecurityPolicy.mRotationTime = 32;
        dataset.mSecurityPolicy.mFlags        = kSecurityPolicyFlags;
        dataset.mPresentFlags |= ActiveOperationalDataset::kSecurityPolicyBit;

        std::string              json = ActiveDatasetToJson(dataset);
        ActiveOperationalDataset dataset1;

        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);
        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit));
        EXPECT_EQ(dataset1.mSecurityPolicy.mFlags, kSecurityPolicyFlags);
    }

    // channel mask serialization & deserialization
    {
        dataset.mChannelMask = {{1, {0xFF, 0xEE}}};
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelMaskBit;

        std::string              json = ActiveDatasetToJson(dataset);
        ActiveOperationalDataset dataset1;

        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);
        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit));
        EXPECT_TRUE(dataset1.mChannelMask.size() == 1);
        EXPECT_TRUE(dataset1.mChannelMask[0].mPage == 1);
        EXPECT_TRUE(dataset1.mChannelMask[0].mMasks == dataset.mChannelMask[0].mMasks);
    }
}